

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix33<double> * __thiscall
Imath_2_5::Matrix33<double>::operator*
          (Matrix33<double> *__return_storage_ptr__,Matrix33<double> *this,Matrix33<double> *v)

{
  double *pdVar1;
  int i;
  long lVar2;
  double (*padVar3) [3];
  long lVar4;
  double (*padVar5) [3];
  int k;
  long lVar6;
  double dVar7;
  
  Matrix33(__return_storage_ptr__,0.0);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    padVar3 = (double (*) [3])v;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      pdVar1 = __return_storage_ptr__->x[lVar2] + lVar4;
      dVar7 = *pdVar1;
      padVar5 = padVar3;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        dVar7 = dVar7 + (*(double (*) [3])*(double (*) [3])this)[lVar6] *
                        (*(double (*) [3])*padVar5)[0];
        padVar5 = padVar5 + 1;
      }
      *pdVar1 = dVar7;
      padVar3 = (double (*) [3])(*padVar3 + 1);
    }
    this = (Matrix33<double> *)((long)this + 0x18);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix33<T>
Matrix33<T>::operator * (const Matrix33<T> &v) const
{
    Matrix33 tmp (T (0));

    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            for (int k = 0; k < 3; k++)
                tmp.x[i][j] += x[i][k] * v.x[k][j];

    return tmp;
}